

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::GLSLContantImmutablityTest::testInit(GLSLContantImmutablityTest *this)

{
  value_type local_20;
  testCase test_case;
  GLuint stage;
  GLuint constant;
  GLSLContantImmutablityTest *this_local;
  
  for (test_case.m_stage = COMPUTE; test_case.m_stage < TESS_EVAL;
      test_case.m_stage = test_case.m_stage + VERTEX) {
    for (test_case.m_constant = GL_ARB_ENHANCED_LAYOUTS; test_case.m_constant < 6;
        test_case.m_constant = test_case.m_constant + GL_MAX_XFB) {
      local_20.m_constant = test_case.m_stage;
      local_20.m_stage = test_case.m_constant;
      std::
      vector<gl4cts::EnhancedLayouts::GLSLContantImmutablityTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::GLSLContantImmutablityTest::testCase>_>
      ::push_back(&this->m_test_cases,&local_20);
    }
  }
  return;
}

Assistant:

void GLSLContantImmutablityTest::testInit()
{
	for (GLuint constant = 0; constant < CONSTANTS_MAX; ++constant)
	{
		for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
		{
			testCase test_case = { (CONSTANTS)constant, (Utils::Shader::STAGES)stage };

			m_test_cases.push_back(test_case);
		}
	}
}